

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvtable.h
# Opt level: O3

ssize_t __thiscall
CSVTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::write
          (CSVTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  ostream *in_RAX;
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint i;
  undefined4 in_register_00000034;
  ostream *poVar3;
  pointer pCVar4;
  char *pcVar5;
  
  poVar3 = (ostream *)CONCAT44(in_register_00000034,__fd);
  pCVar4 = (this->columns).
           super__Vector_base<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar4 != (this->columns).
                super__Vector_base<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar5 = "";
    do {
      sVar1 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,sVar1);
      in_RAX = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(pCVar4->header)._M_dataplus._M_p,(pCVar4->header)._M_string_length
                         );
      pCVar4 = pCVar4 + 1;
      pcVar5 = ",";
    } while (pCVar4 != (this->columns).
                       super__Vector_base<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (this->nrows != 0) {
    i = 0;
    do {
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)__fd);
      std::ostream::put((char)__fd);
      in_RAX = (ostream *)std::ostream::flush();
      pCVar4 = (this->columns).
               super__Vector_base<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pCVar4 != (this->columns).
                    super__Vector_base<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar5 = "";
        do {
          sVar1 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,sVar1);
          pbVar2 = CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator[](pCVar4,i);
          in_RAX = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
          pCVar4 = pCVar4 + 1;
          pcVar5 = ",";
        } while (pCVar4 != (this->columns).
                           super__Vector_base<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      i = i + 1;
    } while (i < this->nrows);
  }
  return (ssize_t)in_RAX;
}

Assistant:

void write(std::ostream& os) const
  {
    const char* comma = "";
    typename std::vector<CSVTableColumn<Tvar> >::const_iterator it;

    for (it = columns.begin(); it != columns.end(); it++) {
      os << comma << it->getHeader();
      comma = ",";
    }

    for (unsigned i=0; i < nrows; i++) {
      comma = "";
      os << std::endl;
      for (it = columns.begin(); it != columns.end(); it++) {
	os << comma << (*it)[i];
	comma = ",";
      }
    }
  }